

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImTriangulator::BuildEars(ImTriangulator *this)

{
  int iVar1;
  ImTriangulatorNode *pIVar2;
  bool bVar3;
  int iVar4;
  ImTriangulatorNode **ppIVar5;
  
  if (-1 < this->_TrianglesLeft) {
    ppIVar5 = &this->_Nodes;
    iVar4 = this->_TrianglesLeft + 1;
    do {
      pIVar2 = *ppIVar5;
      if (pIVar2->Type == ImTriangulatorNodeType_Convex) {
        bVar3 = IsEar(this,pIVar2->Prev->Index,pIVar2->Index,pIVar2->Next->Index,&pIVar2->Prev->Pos,
                      &pIVar2->Pos,&pIVar2->Next->Pos);
        if (bVar3) {
          pIVar2->Type = ImTriangulatorNodeType_Ear;
          iVar1 = (this->_Ears).Size;
          (this->_Ears).Size = iVar1 + 1;
          (this->_Ears).Data[iVar1] = pIVar2;
        }
      }
      ppIVar5 = &pIVar2->Next;
      iVar4 = iVar4 + -1;
    } while (0 < iVar4);
  }
  return;
}

Assistant:

void ImTriangulator::BuildEars()
{
    ImTriangulatorNode* n1 = _Nodes;
    for (int i = _TrianglesLeft; i >= 0; i--, n1 = n1->Next)
    {
        if (n1->Type != ImTriangulatorNodeType_Convex)
            continue;
        if (!IsEar(n1->Prev->Index, n1->Index, n1->Next->Index, n1->Prev->Pos, n1->Pos, n1->Next->Pos))
            continue;
        n1->Type = ImTriangulatorNodeType_Ear;
        _Ears.push_back(n1);
    }
}